

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall
Json::BuiltStyledStreamWriter::writeWithIndent(BuiltStyledStreamWriter *this,String *value)

{
  if ((this->field_0xd8 & 2) == 0) {
    writeIndent(this);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamWriter).sout_,(value->_M_dataplus)._M_p,value->_M_string_length);
  this->field_0xd8 = this->field_0xd8 & 0xfd;
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeWithIndent(String const& value) {
  if (!indented_)
    writeIndent();
  *sout_ << value;
  indented_ = false;
}